

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void qtree_reduce(uchar *a,int n,int nx,int ny,uchar *b)

{
  int s00;
  int s10;
  int k;
  int j;
  int i;
  uchar *b_local;
  int ny_local;
  int nx_local;
  int n_local;
  uchar *a_local;
  
  k = 0;
  for (i = 0; i < nx + -1; i = i + 2) {
    s00 = n * i;
    s10 = s00 + n;
    for (j = 0; j < ny + -1; j = j + 2) {
      b[k] = a[s10 + 1] != '\0' | (a[s10] != '\0') << 1 | (a[s00 + 1] != '\0') << 2 |
             (a[s00] != '\0') << 3;
      k = k + 1;
      s00 = s00 + 2;
      s10 = s10 + 2;
    }
    if (j < ny) {
      b[k] = (a[s10] != '\0') << 1 | (a[s00] != '\0') << 3;
      k = k + 1;
    }
  }
  if (i < nx) {
    s00 = n * i;
    for (j = 0; j < ny + -1; j = j + 2) {
      b[k] = (a[s00 + 1] != '\0') << 2 | (a[s00] != '\0') << 3;
      k = k + 1;
      s00 = s00 + 2;
    }
    if (j < ny) {
      b[k] = (a[s00] != '\0') << 3;
    }
  }
  return;
}

Assistant:

static void
qtree_reduce(unsigned char a[], int n, int nx, int ny, unsigned char b[])
{
int i, j, k;
int s10, s00;

	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] =	(a[s10+1] != 0)
				| ( (a[s10  ] != 0) << 1)
				| ( (a[s00+1] != 0) << 2)
				| ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] =  ( (a[s10  ] != 0) << 1)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] =  ( (a[s00+1] != 0) << 2)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
}